

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::cmMakefileTargetGenerator
          (cmMakefileTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  cmTarget *pcVar2;
  char *pcVar3;
  cmGlobalUnixMakefileGenerator3 *pcVar4;
  cmake *pcVar5;
  cmState *this_00;
  bool bVar6;
  cmLocalUnixMakefileGenerator3 *pcVar7;
  char *pcVar8;
  MacOSXContentGeneratorType *pMVar9;
  string local_50;
  
  this->_vptr_cmMakefileTargetGenerator = (_func_int **)&PTR__cmMakefileTargetGenerator_005b7248;
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  (this->ConfigName)._M_string_length = 0;
  (this->ConfigName).field_2._M_local_buf[0] = '\0';
  (this->BuildFileName)._M_dataplus._M_p = (pointer)&(this->BuildFileName).field_2;
  (this->BuildFileName)._M_string_length = 0;
  (this->BuildFileName).field_2._M_local_buf[0] = '\0';
  (this->BuildFileNameFull)._M_dataplus._M_p = (pointer)&(this->BuildFileNameFull).field_2;
  (this->BuildFileNameFull)._M_string_length = 0;
  (this->BuildFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->ProgressFileNameFull)._M_dataplus._M_p = (pointer)&(this->ProgressFileNameFull).field_2;
  (this->ProgressFileNameFull)._M_string_length = 0;
  (this->ProgressFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->TargetBuildDirectory)._M_dataplus._M_p = (pointer)&(this->TargetBuildDirectory).field_2;
  (this->TargetBuildDirectory)._M_string_length = 0;
  (this->TargetBuildDirectory).field_2._M_local_buf[0] = '\0';
  (this->TargetBuildDirectoryFull)._M_dataplus._M_p =
       (pointer)&(this->TargetBuildDirectoryFull).field_2;
  (this->TargetBuildDirectoryFull)._M_string_length = 0;
  (this->TargetBuildDirectoryFull).field_2._M_local_buf[0] = '\0';
  (this->FlagFileNameFull)._M_dataplus._M_p = (pointer)&(this->FlagFileNameFull).field_2;
  (this->FlagFileNameFull)._M_string_length = 0;
  (this->FlagFileNameFull).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->InfoFileNameFull)._M_dataplus._M_p = (pointer)&(this->InfoFileNameFull).field_2;
  (this->InfoFileNameFull)._M_string_length = 0;
  (this->InfoFileNameFull).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CleanFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CleanFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CleanFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetNameOut)._M_dataplus._M_p = (pointer)&(this->TargetNameOut).field_2;
  (this->TargetNameOut)._M_string_length = 0;
  (this->TargetNameOut).field_2._M_local_buf[0] = '\0';
  (this->TargetNameSO)._M_dataplus._M_p = (pointer)&(this->TargetNameSO).field_2;
  (this->TargetNameSO)._M_string_length = 0;
  (this->TargetNameSO).field_2._M_local_buf[0] = '\0';
  (this->TargetNameReal)._M_dataplus._M_p = (pointer)&(this->TargetNameReal).field_2;
  (this->TargetNameReal)._M_string_length = 0;
  (this->TargetNameReal).field_2._M_local_buf[0] = '\0';
  (this->TargetNameImport)._M_dataplus._M_p = (pointer)&(this->TargetNameImport).field_2;
  (this->TargetNameImport)._M_string_length = 0;
  (this->TargetNameImport).field_2._M_local_buf[0] = '\0';
  (this->TargetNamePDB)._M_dataplus._M_p = (pointer)&(this->TargetNamePDB).field_2;
  (this->TargetNamePDB)._M_string_length = 0;
  (this->TargetNamePDB).field_2._M_local_buf[0] = '\0';
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->MacOSXContentGenerator = (MacOSXContentGeneratorType *)0x0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->OSXBundleGenerator = (cmOSXBundleGenerator *)0x0;
  p_Var1 = &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DefinesByLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->FortranModuleDirectory)._M_dataplus._M_p = (pointer)&(this->FortranModuleDirectory).field_2
  ;
  (this->FortranModuleDirectory)._M_string_length = 0;
  (this->FortranModuleDirectory).field_2._M_local_buf[0] = '\0';
  this->BuildFileStream = (cmGeneratedFileStream *)0x0;
  this->InfoFileStream = (cmGeneratedFileStream *)0x0;
  this->FlagFileStream = (cmGeneratedFileStream *)0x0;
  this->CustomCommandDriver = OnBuild;
  this->FortranModuleDirectoryComputed = false;
  pcVar2 = target->Target;
  this->Target = pcVar2;
  this->Makefile = pcVar2->Makefile;
  pcVar7 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar7;
  pcVar8 = (pcVar7->ConfigurationName)._M_dataplus._M_p;
  pcVar3 = (char *)(this->ConfigName)._M_string_length;
  strlen(pcVar8);
  std::__cxx11::string::_M_replace((ulong)&this->ConfigName,0,pcVar3,(ulong)pcVar8);
  pcVar4 = (cmGlobalUnixMakefileGenerator3 *)
           (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator;
  this->GlobalGenerator = pcVar4;
  this->GeneratorTarget = target;
  pcVar5 = (pcVar4->super_cmGlobalGenerator).CMakeInstance;
  this->NoRuleMessages = false;
  this_00 = pcVar5->State;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"RULE_MESSAGES","");
  pcVar8 = cmState::GetGlobalProperty(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pcVar8 != (char *)0x0) {
    bVar6 = cmSystemTools::IsOff(pcVar8);
    this->NoRuleMessages = bVar6;
  }
  pMVar9 = (MacOSXContentGeneratorType *)operator_new(0x10);
  (pMVar9->super_MacOSXContentGeneratorType)._vptr_MacOSXContentGeneratorType =
       (_func_int **)&PTR__MacOSXContentGeneratorType_005b7280;
  pMVar9->Generator = this;
  this->MacOSXContentGenerator = pMVar9;
  return;
}

Assistant:

cmMakefileTargetGenerator::cmMakefileTargetGenerator(cmGeneratorTarget* target)
  : OSXBundleGenerator(0)
  , MacOSXContentGenerator(0)
{
  this->BuildFileStream = 0;
  this->InfoFileStream = 0;
  this->FlagFileStream = 0;
  this->CustomCommandDriver = OnBuild;
  this->FortranModuleDirectoryComputed = false;
  this->Target = target->Target;
  this->Makefile = this->Target->GetMakefile();
  this->LocalGenerator =
    static_cast<cmLocalUnixMakefileGenerator3*>(target->GetLocalGenerator());
  this->ConfigName = this->LocalGenerator->ConfigurationName.c_str();
  this->GlobalGenerator =
    static_cast<cmGlobalUnixMakefileGenerator3*>(
      this->LocalGenerator->GetGlobalGenerator());
  this->GeneratorTarget = target;
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->NoRuleMessages = false;
  if(const char* ruleStatus = cm->GetState()
                                ->GetGlobalProperty("RULE_MESSAGES"))
    {
    this->NoRuleMessages = cmSystemTools::IsOff(ruleStatus);
    }
  MacOSXContentGenerator = new MacOSXContentGeneratorType(this);
}